

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

ssize_t __thiscall JSON::JSON_array::write(JSON_array *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  reference element_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  JSON *element;
  const_iterator __end1;
  const_iterator __begin1;
  vector<JSON,_std::allocator<JSON>_> *__range1;
  void *pvStack_20;
  bool first;
  size_t depth_local;
  Pipeline *p_local;
  JSON_array *this_local;
  
  depth_local = CONCAT44(in_register_00000034,__fd);
  __range1._7_1_ = 1;
  pvStack_20 = __buf;
  p_local = (Pipeline *)this;
  writeArrayOpen((Pipeline *)depth_local,(bool *)((long)&__range1 + 7),(size_t)__buf);
  __end1 = std::vector<JSON,_std::allocator<JSON>_>::begin(&this->elements);
  element = (JSON *)std::vector<JSON,_std::allocator<JSON>_>::end(&this->elements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>
                                *)&element);
    if (!bVar1) break;
    element_00 = __gnu_cxx::
                 __normal_iterator<const_JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
                 operator*(&__end1);
    writeArrayItem((Pipeline *)depth_local,(bool *)((long)&__range1 + 7),element_00,
                   (long)pvStack_20 + 1);
    __gnu_cxx::__normal_iterator<const_JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
    operator++(&__end1);
  }
  writeArrayClose((Pipeline *)depth_local,(bool)(__range1._7_1_ & 1),(size_t)pvStack_20);
  return extraout_RAX;
}

Assistant:

void
JSON::JSON_array::write(Pipeline* p, size_t depth) const
{
    bool first = true;
    writeArrayOpen(p, first, depth);
    for (auto const& element: elements) {
        writeArrayItem(p, first, element, 1 + depth);
    }
    writeArrayClose(p, first, depth);
}